

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O3

void __thiscall Balk::func(Balk *this,int degree,double value)

{
  pointer psVar1;
  element_type *peVar2;
  iterator __position;
  pointer psVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  vector<double,_std::allocator<double>_> vec;
  double local_70;
  vector<double,_std::allocator<double>_> local_68;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  psVar3 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_50 = value;
  if (psVar3 == psVar1) {
    local_48 = 0.0;
    uStack_40 = 0;
  }
  else {
    local_48 = 0.0;
    uStack_40 = 0;
    do {
      peVar2 = (psVar3->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar2->is_unknown == true) &&
         ((peVar2->initial_variable != false ||
          ((peVar2->shift != 0 && (peVar2->shift != this->balk_size)))))) {
        (*peVar2->_vptr_Term[2])(local_50,peVar2,degree);
        if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_68,
                     (iterator)
                     local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_70);
        }
        else {
          *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = extraout_XMM0_Qa;
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      else {
        (*peVar2->_vptr_Term[2])(local_50,peVar2,degree);
        local_48 = local_48 + extraout_XMM0_Qa_00;
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&this->A,&local_68);
  local_70 = -local_48;
  __position._M_current =
       (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  if (__position._M_current ==
      (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->b,__position,&local_70);
  }
  else {
    *__position._M_current = local_70;
    (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Balk::func(int degree, double value)
{
    std::vector<double> vec;
    double right_part = 0;
    for (auto &el : terms)
    {
        if ((el->isUnknown()) && (el->initial_variable || ((el->getShift() != 0) && (el->getShift() != balk_size))))
        {
            vec.push_back(el->calculate(value, degree));
        }
        else
        {
            right_part += el->calculate(value, degree);
        }
    }
    A.push_back(std::move(vec));
    b.push_back(-right_part);
}